

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::enqueueObject(QPDFWriter *this,QPDFObjectHandle *object)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  QPDF *pQVar3;
  logic_error *this_01;
  size_type sVar4;
  element_type *peVar5;
  reference pQVar6;
  bool local_161;
  QPDFObjectHandle local_138;
  reference local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item_1;
  iterator __end5;
  iterator __begin5;
  Dictionary *__range5;
  Dictionary d;
  QPDFObjectHandle *item;
  iterator __end4;
  iterator __begin4;
  Array *__range4;
  int local_a4;
  QPDFObjectHandle local_a0;
  QPDFObjGen local_90;
  Object *local_88;
  Object *obj;
  QPDFObjGen og;
  allocator<char> local_49;
  string local_48;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *object_local;
  QPDFWriter *this_local;
  
  local_18 = object;
  object_local = (QPDFObjectHandle *)this;
  bVar1 = QPDFObjectHandle::isIndirect(object);
  if (bVar1) {
    pQVar3 = QPDFObjectHandle::getOwningQPDF(object);
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if (pQVar3 != peVar5->pdf) {
      QTC::TC("qpdf","QPDFWriter foreign object",0);
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_01,
                 "QPDFObjectHandle from different QPDF found while writing.  Use QPDF::copyForeignObject to add objects from another file."
                );
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    og.obj._2_1_ = 0;
    og.obj._1_1_ = 0;
    bVar1 = (peVar5->qdf_mode & 1U) != 0;
    local_161 = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/XRef",&local_49);
      std::allocator<char>::allocator();
      og.obj._2_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&og.gen,"",(allocator<char> *)((long)&og.obj + 3));
      og.obj._1_1_ = 1;
      local_161 = QPDFObjectHandle::isStreamOfType(object,&local_48,(string *)&og.gen);
    }
    if ((og.obj._1_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&og.gen);
    }
    if ((og.obj._2_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&og.obj + 3));
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    if (local_161 == false) {
      register0x00000000 = QPDFObjectHandle::getObjGen(object);
      peVar5 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_90 = stack0xffffffffffffff84;
      local_88 = ObjTable<QPDFWriter::Object>::operator[]
                           (&(peVar5->obj).super_ObjTable<QPDFWriter::Object>,
                            stack0xffffffffffffff84);
      if (local_88->renumber == 0) {
        if (local_88->object_stream < 1) {
          peVar5 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&peVar5->object_queue,object);
          peVar5 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          iVar2 = peVar5->next_objid;
          peVar5->next_objid = iVar2 + 1;
          local_88->renumber = iVar2;
          iVar2 = QPDFObjGen::getGen((QPDFObjGen *)((long)&obj + 4));
          bVar1 = false;
          if (iVar2 == 0) {
            peVar5 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            local_a4 = QPDFObjGen::getObj((QPDFObjGen *)((long)&obj + 4));
            sVar4 = std::
                    map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
                    ::count(&peVar5->object_stream_to_objects,&local_a4);
            bVar1 = sVar4 != 0;
          }
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            if ((peVar5->linearized & 1U) == 0) {
              assignCompressedObjectNumbers(this,stack0xffffffffffffff84);
            }
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            if (((peVar5->direct_stream_lengths & 1U) == 0) &&
               (bVar1 = QPDFObjectHandle::isStream(object), bVar1)) {
              peVar5 = std::
                       __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              peVar5->next_objid = peVar5->next_objid + 1;
            }
          }
        }
        else {
          local_88->renumber = -1;
          peVar5 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          QPDF::getObject((QPDF *)&local_a0,(int)peVar5->pdf,local_88->object_stream);
          enqueueObject(this,&local_a0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
        }
      }
    }
    else {
      QTC::TC("qpdf","QPDFWriter ignore XRef in qdf mode",0);
    }
  }
  else {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar5->linearized & 1U) == 0) {
      bVar1 = QPDFObjectHandle::isArray(object);
      if (bVar1) {
        QPDFObjectHandle::as_array((Array *)&__begin4,object,any);
        __end4 = ::qpdf::Array::begin((Array *)&__begin4);
        item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                           *)&item), bVar1) {
          pQVar6 = __gnu_cxx::
                   __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                   ::operator*(&__end4);
          this_00 = &d.super_BaseDictionary.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_00,pQVar6);
          enqueueObject(this,(QPDFObjectHandle *)this_00);
          QPDFObjectHandle::~QPDFObjectHandle
                    ((QPDFObjectHandle *)
                     &d.super_BaseDictionary.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end4);
        }
        ::qpdf::Array::~Array((Array *)&__begin4);
      }
      else {
        QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__range5,(typed)object);
        bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)&__range5);
        if (bVar1) {
          __end5 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__range5);
          item_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                    *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__range5);
          while (bVar1 = std::operator!=(&__end5,(_Self *)&item_1), bVar1) {
            local_128 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                        ::operator*(&__end5);
            bVar1 = ::qpdf::BaseHandle::null(&(local_128->second).super_BaseHandle);
            if (!bVar1) {
              QPDFObjectHandle::QPDFObjectHandle(&local_138,&local_128->second);
              enqueueObject(this,&local_138);
              QPDFObjectHandle::~QPDFObjectHandle(&local_138);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
            ::operator++(&__end5);
          }
        }
        ::qpdf::Dictionary::~Dictionary((Dictionary *)&__range5);
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::enqueueObject(QPDFObjectHandle object)
{
    if (object.isIndirect()) {
        // This owner check can only be done for indirect objects. It is possible for a direct
        // object to have an owning QPDF that is from another file if a direct QPDFObjectHandle from
        // one file was insert into another file without copying. Doing that is safe even if the
        // original QPDF gets destroyed, which just disconnects the QPDFObjectHandle from its owner.
        if (object.getOwningQPDF() != &(m->pdf)) {
            QTC::TC("qpdf", "QPDFWriter foreign object");
            throw std::logic_error(
                "QPDFObjectHandle from different QPDF found while writing.  Use "
                "QPDF::copyForeignObject to add objects from another file.");
        }

        if (m->qdf_mode && object.isStreamOfType("/XRef")) {
            // As a special case, do not output any extraneous XRef streams in QDF mode. Doing so
            // will confuse fix-qdf, which expects to see only one XRef stream at the end of the
            // file. This case can occur when creating a QDF from a file with object streams when
            // preserving unreferenced objects since the old cross reference streams are not
            // actually referenced by object number.
            QTC::TC("qpdf", "QPDFWriter ignore XRef in qdf mode");
            return;
        }

        QPDFObjGen og = object.getObjGen();
        auto& obj = m->obj[og];

        if (obj.renumber == 0) {
            if (obj.object_stream > 0) {
                // This is in an object stream.  Don't process it here.  Instead, enqueue the object
                // stream.  Object streams always have generation 0.
                // Detect loops by storing invalid object ID -1, which will get overwritten later.
                obj.renumber = -1;
                enqueueObject(m->pdf.getObject(obj.object_stream, 0));
            } else {
                m->object_queue.push_back(object);
                obj.renumber = m->next_objid++;

                if ((og.getGen() == 0) && m->object_stream_to_objects.count(og.getObj())) {
                    // For linearized files, uncompressed objects go at end, and we take care of
                    // assigning numbers to them elsewhere.
                    if (!m->linearized) {
                        assignCompressedObjectNumbers(og);
                    }
                } else if ((!m->direct_stream_lengths) && object.isStream()) {
                    // reserve next object ID for length
                    ++m->next_objid;
                }
            }
        } else if (obj.renumber == -1) {
            // This can happen if a specially constructed file indicates that an object stream is
            // inside itself.
        }
        return;
    } else if (!m->linearized) {
        if (object.isArray()) {
            for (auto& item: object.as_array()) {
                enqueueObject(item);
            }
        } else if (auto d = object.as_dictionary()) {
            for (auto const& item: d) {
                if (!item.second.null()) {
                    enqueueObject(item.second);
                }
            }
        }
    } else {
        // ignore
    }
}